

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O1

void __thiscall SqlGenerator::generateLoadQuery(SqlGenerator *this)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  TDNode *__rhs;
  long *plVar5;
  Attribute *pAVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char cVar14;
  undefined8 uVar15;
  char *__end;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string drop_views;
  string drop;
  string __str_2;
  string load;
  ofstream ofs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  long *local_300;
  long local_2f8;
  undefined8 local_2f0;
  long lStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  SqlGenerator *local_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ulong local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_2c0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"","");
  uVar16 = 0;
  while( true ) {
    paVar13 = &local_320.field_2;
    sVar4 = TreeDecomposition::numberOfRelations
                      ((local_2c0->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar4 <= uVar16) break;
    __rhs = TreeDecomposition::getRelation
                      ((local_2c0->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       uVar16);
    std::operator+(&local_320,"DROP TABLE IF EXISTS ",&__rhs->_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_320);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_220 = *plVar9;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar9;
      local_230 = (long *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar13) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    std::operator+(&local_320,"CREATE TABLE ",&__rhs->_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_320);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_220 = *plVar9;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar9;
      local_230 = (long *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    local_258 = uVar16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar13) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    uVar16 = 0;
    do {
      if (((__rhs->_bag).super__Base_bitset<2UL>._M_w[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) {
        pAVar6 = TreeDecomposition::getAttribute
                           ((local_2c0->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar16);
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        pcVar1 = (pAVar6->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_340,pcVar1,pcVar1 + (pAVar6->_name)._M_string_length);
        std::__cxx11::string::append((char *)&local_340);
        switch(pAVar6->_type) {
        case Integer:
        case Short:
        case U_Integer:
          local_2f0 = CONCAT53(local_2f0._3_5_,0x740000);
          local_2f0 = CONCAT62(local_2f0._2_6_,0x6e69);
          local_2f8 = 3;
          puVar7 = (undefined1 *)((long)&local_2f0 + 3);
          break;
        case Double:
          local_2f0 = CONCAT17(local_2f0._7_1_,0x63697265000000);
          local_2f0 = CONCAT44(local_2f0._4_4_,0x656d756e);
          local_2f8 = 7;
          puVar7 = (undefined1 *)((long)&local_2f0 + 7);
          break;
        default:
          std::operator<<((ostream *)&std::cerr,
                          "This type does not exist  (SqlGenerator - typeToString)\n");
          exit(1);
        }
        local_300 = &local_2f0;
        *puVar7 = 0;
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          uVar15 = local_340.field_2._M_allocated_capacity;
        }
        if (((ulong)uVar15 < local_2f8 + local_340._M_string_length) &&
           (local_2f8 + local_340._M_string_length < 0x10)) {
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_300,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_300);
        }
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320.field_2._8_8_ = puVar8[3];
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar11;
          local_320._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_320._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)psVar11 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        plVar5 = puVar8 + 2;
        if ((long *)*puVar8 == plVar5) {
          local_220 = *plVar5;
          lStack_218 = puVar8[3];
          local_230 = &local_220;
        }
        else {
          local_220 = *plVar5;
          local_230 = (long *)*puVar8;
        }
        local_228 = puVar8[1];
        *puVar8 = plVar5;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_230);
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 100);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)&local_278);
    std::operator+(&local_250,"\\COPY ",&__rhs->_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_298 = &local_288;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_288 = *plVar9;
      lStack_280 = plVar5[3];
    }
    else {
      local_288 = *plVar9;
      local_298 = (long *)*plVar5;
    }
    local_290 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_298,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
    local_2b8 = &local_2a8;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_2a8 = *plVar9;
      lStack_2a0 = plVar5[3];
    }
    else {
      local_2a8 = *plVar9;
      local_2b8 = (long *)*plVar5;
    }
    local_2b0 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_300 = &local_2f0;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_2f0 = *plVar9;
      lStack_2e8 = plVar5[3];
    }
    else {
      local_2f0 = *plVar9;
      local_300 = (long *)*plVar5;
    }
    local_2f8 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_300,(ulong)(__rhs->_name)._M_dataplus._M_p);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    puVar10 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_340.field_2._M_allocated_capacity = *puVar10;
      local_340.field_2._8_8_ = plVar5[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar10;
      local_340._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_340._M_string_length = plVar5[1];
    *plVar5 = (long)puVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_320.field_2._M_allocated_capacity = *psVar11;
      local_320.field_2._8_8_ = puVar8[3];
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    }
    else {
      local_320.field_2._M_allocated_capacity = *psVar11;
      local_320._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_320._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    plVar5 = puVar8 + 2;
    if ((long *)*puVar8 == plVar5) {
      local_220 = *plVar5;
      lStack_218 = puVar8[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*puVar8;
    }
    local_228 = puVar8[1];
    *puVar8 = plVar5;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298);
    }
    uVar16 = local_258;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    uVar16 = uVar16 + 1;
  }
  local_320._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_320);
  std::ofstream::ofstream(&local_230,(string *)&local_320,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar13) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  std::operator+(&local_320,&local_2e0,&local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_320._M_dataplus._M_p,local_320._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar13) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_320._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
  uVar16 = 0;
  do {
    sVar4 = QueryCompiler::numberOfViews
                      ((local_2c0->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar4 <= uVar16) {
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_340);
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_320._M_dataplus._M_p,local_320._M_string_length);
      std::ofstream::close();
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_340);
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p);
      }
      std::operator+(&local_340,&local_2e0,&local_320);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_340._M_dataplus._M_p,local_340._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p);
      }
      std::ofstream::close();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      local_230 = _VTT;
      *(undefined8 *)((long)&local_230 + _VTT[-3]) = _error_with_option_name;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      return;
    }
    cVar14 = '\x01';
    if (9 < uVar16) {
      uVar12 = uVar16;
      cVar3 = '\x04';
      do {
        cVar14 = cVar3;
        if (uVar12 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00298a46;
        }
        if (uVar12 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00298a46;
        }
        if (uVar12 < 10000) goto LAB_00298a46;
        bVar2 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar3 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
LAB_00298a46:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,(uint)local_2b0,uVar16);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x2b4c2a);
    local_300 = &local_2f0;
    plVar5 = puVar8 + 2;
    if ((long *)*puVar8 == plVar5) {
      local_2f0 = *plVar5;
      lStack_2e8 = puVar8[3];
    }
    else {
      local_2f0 = *plVar5;
      local_300 = (long *)*puVar8;
    }
    local_2f8 = puVar8[1];
    *puVar8 = plVar5;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    puVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_340.field_2._M_allocated_capacity = *puVar10;
      local_340.field_2._8_8_ = puVar8[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar10;
      local_340._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_340._M_string_length = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_340._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateLoadQuery()
{
    string load = "", drop = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;

        drop += "DROP TABLE IF EXISTS "+relName+";\n";
        
        load += "CREATE TABLE "+relName+ "(";
        for (size_t var = 0; var < NUM_OF_VARIABLES; var++)
        {
            if (rel->_bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                load += att->_name+" "+typeToStr(att->_type)+",";
            }
        }
        load.pop_back();
        load += ");\n";

        load += "\\COPY "+relName+" FROM \'"+multifaq::dir::PATH_TO_DATA+"/"+relName+".tbl\' "+
                "DELIMITER \'|\' CSV;\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/load_data.sql", std::ofstream::out);
    ofs << drop + load;
    ofs.close();
    // DINFO(drop + load);

    string drop_views = "";

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        drop_views +=  "DROP TABLE IF EXISTS view_"+std::to_string(viewID)+";\n";

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao_cleanup.sql", std::ofstream::out);
    ofs << drop_views;
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/drop_data.sql", std::ofstream::out);
    ofs << drop + drop_views;
    ofs.close();
}